

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O2

_Bool chunk_list_remove(char *name)

{
  ulong uVar1;
  chunk_conflict **ppcVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar6;
  
  ppcVar2 = chunk_list;
  uVar5 = (uint)chunk_list_max;
  uVar6 = (ulong)uVar5;
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    iVar3 = strcmp(name,ppcVar2[uVar7]->name);
    uVar1 = uVar7;
    if (iVar3 == 0) goto LAB_0014c3c1;
  }
LAB_0014c3f5:
  return uVar7 < uVar6;
LAB_0014c3c1:
  while (uVar4 = uVar1 + 1, uVar4 < uVar6) {
    chunk_list[uVar1] = chunk_list[uVar4];
    uVar1 = uVar4;
  }
  uVar5 = uVar5 - 1;
  chunk_list_max = (uint16_t)uVar5;
  chunk_list[uVar5 & 0xffff] = (chunk_conflict *)0x0;
  goto LAB_0014c3f5;
}

Assistant:

bool chunk_list_remove(const char *name)
{
	int i;

	/* Find the match */
	for (i = 0; i < chunk_list_max; i++) {
		if (streq(name, chunk_list[i]->name)) {
			/* Copy all the succeeding chunks back one */
			int j;
			for (j = i + 1; j < chunk_list_max; j++) {
				chunk_list[j - 1] = chunk_list[j];
			}

			/* Shorten the list and return */
			chunk_list_max--;
			chunk_list[chunk_list_max] = NULL;
			return true;
		}
	}

	return false;
}